

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O1

RealType __thiscall OpenMD::NPAT::calcConservedQuantity(NPAT *this)

{
  Thermo *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  SimInfo *this_01;
  RealType RVar9;
  RealType RVar10;
  double dVar11;
  int iVar12;
  double *pdVar13;
  uint i;
  long lVar14;
  Mat3x3d *pMVar15;
  double *pdVar16;
  uint j;
  long lVar17;
  Mat3x3d *pMVar18;
  uint k;
  long lVar19;
  double tmp_1;
  undefined1 auVar20 [16];
  pair<double,_double> pVar21;
  SquareMatrix3<double> result_1;
  SquareMatrix<double,_3> tmp;
  SquareMatrix3<double> result;
  double local_f8 [28];
  
  pVar21 = Snapshot::getThermostat
                     ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  (this->super_NPT).thermostat.first = pVar21.first;
  (this->super_NPT).thermostat.second = pVar21.second;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])(this);
  this_01 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_;
  (this->super_NPT).NkBT =
       (double)this_01->nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  iVar8 = this_01->ndf_;
  iVar12 = SimInfo::getFdf(this_01);
  (this->super_NPT).fkBT = (double)(iVar8 - iVar12) * 8.31451e-07 * (this->super_NPT).targetTemp;
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar9 = Thermo::getTotalEnergy(this_00);
  dVar1 = (this->super_NPT).fkBT;
  dVar2 = (this->super_NPT).tt2;
  dVar3 = (this->super_NPT).thermostat.first;
  dVar11 = (this->super_NPT).thermostat.second;
  pdVar13 = local_f8 + 0x12;
  local_f8[0x18] = 0.0;
  local_f8[0x19] = 0.0;
  local_f8[0x16] = 0.0;
  local_f8[0x17] = 0.0;
  local_f8[0x14] = 0.0;
  local_f8[0x15] = 0.0;
  local_f8[0x12] = 0.0;
  local_f8[0x13] = 0.0;
  local_f8[0x1a] = 0.0;
  lVar14 = 0;
  pMVar15 = &this->eta;
  do {
    lVar17 = 0;
    pdVar16 = pdVar13;
    do {
      *pdVar16 = (pMVar15->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                 [lVar17];
      lVar17 = lVar17 + 1;
      pdVar16 = pdVar16 + 3;
    } while (lVar17 != 3);
    lVar14 = lVar14 + 1;
    pdVar13 = pdVar13 + 1;
    pMVar15 = (Mat3x3d *)
              ((pMVar15->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar14 != 3);
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[8] = 0.0;
  pdVar13 = local_f8 + 0x12;
  lVar14 = 0;
  do {
    lVar17 = 0;
    pMVar15 = &this->eta;
    do {
      dVar4 = local_f8[lVar14 * 3 + lVar17];
      lVar19 = 0;
      pMVar18 = pMVar15;
      do {
        dVar4 = dVar4 + pdVar13[lVar19] *
                        (pMVar18->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0][0];
        lVar19 = lVar19 + 1;
        pMVar18 = (Mat3x3d *)
                  ((pMVar18->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar19 != 3);
      local_f8[lVar14 * 3 + lVar17] = dVar4;
      lVar17 = lVar17 + 1;
      pMVar15 = (Mat3x3d *)
                ((pMVar15->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                + 1);
    } while (lVar17 != 3);
    lVar14 = lVar14 + 1;
    pdVar13 = pdVar13 + 3;
  } while (lVar14 != 3);
  lVar14 = 0;
  do {
    *(undefined8 *)((long)local_f8 + lVar14 + 0x58) =
         *(undefined8 *)((long)local_f8 + lVar14 + 0x10);
    *(undefined8 *)((long)local_f8 + lVar14 + 0x48) = *(undefined8 *)((long)local_f8 + lVar14);
    *(undefined8 *)((long)local_f8 + lVar14 + 0x50) = *(undefined8 *)((long)local_f8 + lVar14 + 8);
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x48);
  dVar4 = 0.0;
  lVar14 = 0;
  do {
    dVar4 = dVar4 + *(double *)((long)local_f8 + lVar14 + 0x48);
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x60);
  dVar5 = (this->super_NPT).NkBT;
  dVar6 = (this->super_NPT).targetPressure;
  dVar7 = (this->super_NPT).tb2;
  RVar10 = Thermo::getVolume(this_00);
  auVar20._0_8_ = dVar1 * dVar11;
  auVar20._8_8_ = dVar4 * dVar5 * dVar7;
  auVar20 = divpd(auVar20,_DAT_002a3700);
  return ((RVar10 * dVar6) / 163882576.0) / 0.0004184 +
         auVar20._8_8_ + RVar9 + (dVar2 * dVar1 * dVar3 * dVar3) / 0.0008368 + auVar20._0_8_;
}

Assistant:

RealType NPAT::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tt2 * thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + thermostat_kinetic +
                        thermostat_potential + barostat_kinetic +
                        barostat_potential;

    return conservedQuantity;
  }